

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::MatchingTest_MatchingWorksWithExtensions_Test::TestBody
          (MatchingTest_MatchingWorksWithExtensions_Test *this)

{
  ExtensionSet *pEVar1;
  FieldDescriptor *this_00;
  Descriptor *this_01;
  FieldDescriptor *key;
  MessageLite *pMVar2;
  char *message;
  undefined1 in_R9B;
  undefined7 in_register_00000089;
  pointer *__ptr;
  string_view name;
  string_view name_00;
  Metadata MVar3;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  TestAllExtensions msg2;
  TestAllExtensions msg1;
  MessageDifferencer differencer;
  AssertHelper AStack_258;
  Message local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_248;
  undefined1 local_240 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  undefined1 local_220 [48];
  undefined1 local_1f0 [48];
  undefined1 local_1c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0 [26];
  
  proto2_unittest::TestAllExtensions::TestAllExtensions((TestAllExtensions *)local_1f0,(Arena *)0x0)
  ;
  proto2_unittest::TestAllExtensions::TestAllExtensions((TestAllExtensions *)local_220,(Arena *)0x0)
  ;
  MVar3 = proto2_unittest::TestAllExtensions::GetMetadata
                    ((TestAllExtensions *)proto2_unittest::_TestAllExtensions_default_instance_);
  name._M_str = "repeated_nested_message_extension";
  name._M_len = 0x21;
  this_00 = FileDescriptor::FindExtensionByName((MVar3.descriptor)->file_,name);
  local_240[0] = (internal)(this_00 != (FieldDescriptor *)0x0);
  local_238 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (this_00 == (FieldDescriptor *)0x0) {
    testing::Message::Message(&local_250);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1c0,(internal *)local_240,(AssertionResult *)"desc == nullptr","true"
               ,"false",(char *)CONCAT71(in_register_00000089,in_R9B));
    testing::internal::AssertHelper::AssertHelper
              (&AStack_258,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x1085,(char *)local_1c0._0_8_);
    testing::internal::AssertHelper::operator=(&AStack_258,&local_250);
    testing::internal::AssertHelper::~AssertHelper(&AStack_258);
    if ((Reporter *)local_1c0._0_8_ != (Reporter *)(local_1c0 + 0x10)) {
      operator_delete((void *)local_1c0._0_8_,local_1b0[0]._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT71(local_250.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_250.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_250.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_250.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
    if (local_238 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_238,local_238);
    }
  }
  else {
    this_01 = FieldDescriptor::message_type(this_00);
    name_00._M_str = "bb";
    name_00._M_len = 2;
    key = Descriptor::FindFieldByName(this_01,name_00);
    util::MessageDifferencer::MessageDifferencer((MessageDifferencer *)local_1c0);
    util::MessageDifferencer::TreatAsMap((MessageDifferencer *)local_1c0,this_00,key);
    pEVar1 = (ExtensionSet *)(local_1f0 + 0x10);
    pMVar2 = protobuf::internal::ExtensionSet::AddMessage
                       (pEVar1,proto2_unittest::repeated_nested_message_extension,'\v',
                        (MessageLite *)
                        &proto2_unittest::_TestAllTypes_NestedMessage_default_instance_,
                        (FieldDescriptor *)0x0);
    *(undefined4 *)&pMVar2[1]._internal_metadata_.ptr_ = 7;
    *(byte *)&pMVar2[1]._vptr_MessageLite = *(byte *)&pMVar2[1]._vptr_MessageLite | 1;
    pMVar2 = protobuf::internal::ExtensionSet::AddMessage
                       (pEVar1,proto2_unittest::repeated_nested_message_extension,'\v',
                        (MessageLite *)
                        &proto2_unittest::_TestAllTypes_NestedMessage_default_instance_,
                        (FieldDescriptor *)0x0);
    *(undefined4 *)&pMVar2[1]._internal_metadata_.ptr_ = 0xd;
    *(byte *)&pMVar2[1]._vptr_MessageLite = *(byte *)&pMVar2[1]._vptr_MessageLite | 1;
    pMVar2 = protobuf::internal::ExtensionSet::AddMessage
                       (pEVar1,proto2_unittest::repeated_nested_message_extension,'\v',
                        (MessageLite *)
                        &proto2_unittest::_TestAllTypes_NestedMessage_default_instance_,
                        (FieldDescriptor *)0x0);
    *(undefined4 *)&pMVar2[1]._internal_metadata_.ptr_ = 0xb;
    *(byte *)&pMVar2[1]._vptr_MessageLite = *(byte *)&pMVar2[1]._vptr_MessageLite | 1;
    pEVar1 = (ExtensionSet *)(local_220 + 0x10);
    pMVar2 = protobuf::internal::ExtensionSet::AddMessage
                       (pEVar1,proto2_unittest::repeated_nested_message_extension,'\v',
                        (MessageLite *)
                        &proto2_unittest::_TestAllTypes_NestedMessage_default_instance_,
                        (FieldDescriptor *)0x0);
    *(undefined4 *)&pMVar2[1]._internal_metadata_.ptr_ = 0xb;
    *(byte *)&pMVar2[1]._vptr_MessageLite = *(byte *)&pMVar2[1]._vptr_MessageLite | 1;
    pMVar2 = protobuf::internal::ExtensionSet::AddMessage
                       (pEVar1,proto2_unittest::repeated_nested_message_extension,'\v',
                        (MessageLite *)
                        &proto2_unittest::_TestAllTypes_NestedMessage_default_instance_,
                        (FieldDescriptor *)0x0);
    *(undefined4 *)&pMVar2[1]._internal_metadata_.ptr_ = 0xd;
    *(byte *)&pMVar2[1]._vptr_MessageLite = *(byte *)&pMVar2[1]._vptr_MessageLite | 1;
    pMVar2 = protobuf::internal::ExtensionSet::AddMessage
                       (pEVar1,proto2_unittest::repeated_nested_message_extension,'\v',
                        (MessageLite *)
                        &proto2_unittest::_TestAllTypes_NestedMessage_default_instance_,
                        (FieldDescriptor *)0x0);
    *(undefined4 *)&pMVar2[1]._internal_metadata_.ptr_ = 7;
    *(byte *)&pMVar2[1]._vptr_MessageLite = *(byte *)&pMVar2[1]._vptr_MessageLite | 1;
    protobuf::(anonymous_namespace)::MatchingTest::RunWithResult_abi_cxx11_
              ((string *)local_240,local_1c0,(MessageDifferencer *)local_1f0,(Message *)local_220,
               (Message *)0x1,(bool)in_R9B);
    testing::internal::CmpHelperEQ<char[680],std::__cxx11::string>
              ((internal *)&local_250,
               "\"matched: (proto2_unittest.repeated_nested_message_extension)[0].bb ->\" \" (proto2_unittest.repeated_nested_message_extension)[2].bb : 7\\n\" \"moved: (proto2_unittest.repeated_nested_message_extension)[0] ->\" \" (proto2_unittest.repeated_nested_message_extension)[2] :\" \" { bb: 7 }\\n\" \"matched: (proto2_unittest.repeated_nested_message_extension)[1].bb :\" \" 13\\n\" \"matched: (proto2_unittest.repeated_nested_message_extension)[1] :\" \" { bb: 13 }\\n\" \"matched: (proto2_unittest.repeated_nested_message_extension)[2].bb ->\" \" (proto2_unittest.repeated_nested_message_extension)[0].bb :\" \" 11\\n\" \"moved: (proto2_unittest.repeated_nested_message_extension)[2] ->\" \" (proto2_unittest.repeated_nested_message_extension)[0] :\" \" { bb: 11 }\\n\""
               ,"RunWithResult(&differencer, msg1, msg2, true)",
               (char (*) [680])
               "matched: (proto2_unittest.repeated_nested_message_extension)[0].bb -> (proto2_unittest.repeated_nested_message_extension)[2].bb : 7\nmoved: (proto2_unittest.repeated_nested_message_extension)[0] -> (proto2_unittest.repeated_nested_message_extension)[2] : { bb: 7 }\nmatched: (proto2_unittest.repeated_nested_message_extension)[1].bb : 13\nmatched: (proto2_unittest.repeated_nested_message_extension)[1] : { bb: 13 }\nmatched: (proto2_unittest.repeated_nested_message_extension)[2].bb -> (proto2_unittest.repeated_nested_message_extension)[0].bb : 11\nmoved: (proto2_unittest.repeated_nested_message_extension)[2] -> (proto2_unittest.repeated_nested_message_extension)[0] : { bb: 11 }\n"
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_240._1_7_,local_240[0]) != &local_230) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_240._1_7_,local_240[0]),local_230._M_allocated_capacity + 1)
      ;
    }
    if (local_250.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)local_240);
      if (local_248 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = anon_var_dwarf_a12c75 + 5;
      }
      else {
        message = (local_248->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&AStack_258,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
                 ,0x10a8,message);
      testing::internal::AssertHelper::operator=(&AStack_258,(Message *)local_240);
      testing::internal::AssertHelper::~AssertHelper(&AStack_258);
      if ((long *)CONCAT71(local_240._1_7_,local_240[0]) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_240._1_7_,local_240[0]) + 8))();
      }
    }
    if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_248,local_248);
    }
    util::MessageDifferencer::~MessageDifferencer((MessageDifferencer *)local_1c0);
  }
  proto2_unittest::TestAllExtensions::~TestAllExtensions((TestAllExtensions *)local_220);
  proto2_unittest::TestAllExtensions::~TestAllExtensions((TestAllExtensions *)local_1f0);
  return;
}

Assistant:

TEST_F(MatchingTest, MatchingWorksWithExtensions) {
  proto2_unittest::TestAllExtensions msg1, msg2;
  proto2_unittest::TestAllTypes::NestedMessage* nested;
  using proto2_unittest::repeated_nested_message_extension;

  const FileDescriptor* descriptor;
  const FieldDescriptor* desc;
  const FieldDescriptor* nested_key;
  descriptor = msg1.GetDescriptor()->file();
  desc = descriptor->FindExtensionByName("repeated_nested_message_extension");
  ASSERT_FALSE(desc == nullptr);
  nested_key = desc->message_type()->FindFieldByName("bb");

  MessageDifferencer differencer;
  differencer.TreatAsMap(desc, nested_key);

  nested = msg1.AddExtension(repeated_nested_message_extension);
  nested->set_bb(7);
  nested = msg1.AddExtension(repeated_nested_message_extension);
  nested->set_bb(13);
  nested = msg1.AddExtension(repeated_nested_message_extension);
  nested->set_bb(11);
  nested = msg2.AddExtension(repeated_nested_message_extension);
  nested->set_bb(11);
  nested = msg2.AddExtension(repeated_nested_message_extension);
  nested->set_bb(13);
  nested = msg2.AddExtension(repeated_nested_message_extension);
  nested->set_bb(7);

  EXPECT_EQ(
      "matched: (proto2_unittest.repeated_nested_message_extension)[0].bb ->"
      " (proto2_unittest.repeated_nested_message_extension)[2].bb : 7\n"
      "moved: (proto2_unittest.repeated_nested_message_extension)[0] ->"
      " (proto2_unittest.repeated_nested_message_extension)[2] :"
      " { bb: 7 }\n"
      "matched: (proto2_unittest.repeated_nested_message_extension)[1].bb :"
      " 13\n"
      "matched: (proto2_unittest.repeated_nested_message_extension)[1] :"
      " { bb: 13 }\n"
      "matched: (proto2_unittest.repeated_nested_message_extension)[2].bb ->"
      " (proto2_unittest.repeated_nested_message_extension)[0].bb :"
      " 11\n"
      "moved: (proto2_unittest.repeated_nested_message_extension)[2] ->"
      " (proto2_unittest.repeated_nested_message_extension)[0] :"
      " { bb: 11 }\n",
      RunWithResult(&differencer, msg1, msg2, true));
}